

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

idx_t duckdb::FindRangeBound<duckdb::GreaterThan,true>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  byte bVar2;
  data_t dVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [12];
  byte bVar12;
  char cVar13;
  bool bVar14;
  short sVar15;
  unsigned_short uVar16;
  uint uVar17;
  int iVar18;
  int64_t ldays;
  reference pvVar19;
  OutOfRangeException *pOVar20;
  unsigned_long uVar21;
  InternalException *this;
  long lVar22;
  ulong uVar24;
  WindowCursor *pWVar25;
  WindowCursor *pWVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int64_t lmicros;
  long lVar30;
  float fVar31;
  hugeint_t hVar32;
  interval_t iVar33;
  WindowColumnIterator<unsigned_long> WVar34;
  WindowColumnIterator<short> WVar35;
  WindowColumnIterator<unsigned_int> WVar36;
  WindowColumnIterator<signed_char> WVar37;
  WindowColumnIterator<unsigned_short> WVar38;
  WindowColumnIterator<unsigned_char> WVar39;
  WindowColumnIterator<int> WVar40;
  WindowColumnIterator<double> WVar41;
  WindowColumnIterator<long> WVar42;
  WindowColumnIterator<float> WVar43;
  WindowColumnIterator<duckdb::uhugeint_t> WVar44;
  WindowColumnIterator<duckdb::interval_t> WVar45;
  WindowColumnIterator<duckdb::hugeint_t> WVar46;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<double> __last_06;
  WindowColumnIterator<long> __last_07;
  WindowColumnIterator<float> __last_08;
  WindowColumnIterator<duckdb::uhugeint_t> __last_09;
  WindowColumnIterator<duckdb::interval_t> __last_10;
  WindowColumnIterator<duckdb::hugeint_t> __last_11;
  OperationCompare<unsigned_char,_duckdb::GreaterThan> comp;
  uchar val;
  double cur_val;
  _Any_data local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  WindowCursor *local_88;
  WindowCursor *local_80;
  _Any_data local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  interval_t local_58;
  long local_48;
  uhugeint_t local_40;
  idx_t iVar23;
  
  auVar11 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  local_88 = range_hi;
  local_80 = range_lo;
  switch(PVar1) {
  case UINT8:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    bVar2 = pvVar19->data[chunk_idx];
    local_58.months._0_1_ = bVar2;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar12 = WindowCursor::GetCell<unsigned_char>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (bVar2 < bVar12) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar12 = WindowCursor::GetCell<unsigned_char>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (bVar12 < bVar2) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        bVar12 = WindowCursor::GetCell<unsigned_char>(pWVar25,0,uVar8);
        if ((bVar2 <= bVar12) && (iVar23 = prev->start, bVar12 <= bVar2)) goto LAB_017a6ca7;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (bVar12 = WindowCursor::GetCell<unsigned_char>(pWVar26,0,uVar8 - 1), bVar12 <= bVar2)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_a8,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_78);
    WVar39.pos = iVar23;
    WVar39.coll = pWVar25;
    __last_04.pos = order_end;
    __last_04.coll = pWVar26;
    WVar39 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::GreaterThan>>
                       (WVar39,__last_04,(uchar *)&local_58,
                        (OperationCompare<unsigned_char,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar39.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6ca7:
    if ((code *)local_68._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    }
    return iVar23;
  case INT8:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    dVar3 = pvVar19->data[chunk_idx];
    local_58.months._0_1_ = dVar3;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar13 = WindowCursor::GetCell<signed_char>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if ((char)dVar3 < cVar13) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar13 = WindowCursor::GetCell<signed_char>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (cVar13 < (char)dVar3) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (cVar13 = WindowCursor::GetCell<signed_char>(pWVar25,0,uVar8), (char)dVar3 <= cVar13)) &&
         (iVar23 = prev->start, cVar13 <= (char)dVar3)) goto LAB_017a687e;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (cVar13 = WindowCursor::GetCell<signed_char>(pWVar26,0,uVar8 - 1), cVar13 <= (char)dVar3))
      {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_a8,
               (function<bool_(signed_char,_signed_char)> *)&local_78);
    WVar37.pos = iVar23;
    WVar37.coll = pWVar25;
    __last_02.pos = order_end;
    __last_02.coll = pWVar26;
    WVar37 = ::std::
             lower_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::GreaterThan>>
                       (WVar37,__last_02,(char *)&local_58,
                        (OperationCompare<signed_char,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar37.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a687e:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case UINT16:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar5 = *(ushort *)(pvVar19->data + chunk_idx * 2);
    local_58.months._0_2_ = uVar5;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar16 = WindowCursor::GetCell<unsigned_short>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (uVar5 < uVar16) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar16 = WindowCursor::GetCell<unsigned_short>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (uVar16 < uVar5) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        uVar16 = WindowCursor::GetCell<unsigned_short>(pWVar25,0,uVar8);
        if ((uVar5 <= uVar16) && (iVar23 = prev->start, uVar16 <= uVar5)) goto LAB_017a6ba8;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (uVar16 = WindowCursor::GetCell<unsigned_short>(pWVar26,0,uVar8 - 1), uVar16 <= uVar5)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_a8,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_78);
    WVar38.pos = iVar23;
    WVar38.coll = pWVar25;
    __last_03.pos = order_end;
    __last_03.coll = pWVar26;
    WVar38 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::GreaterThan>>
                       (WVar38,__last_03,(unsigned_short *)&local_58,
                        (OperationCompare<unsigned_short,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar38.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6ba8:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case INT16:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    sVar4 = *(short *)(pvVar19->data + chunk_idx * 2);
    local_58.months._0_2_ = sVar4;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar15 = WindowCursor::GetCell<short>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (sVar4 < sVar15) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar15 = WindowCursor::GetCell<short>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (sVar15 < sVar4) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (sVar15 = WindowCursor::GetCell<short>(pWVar25,0,uVar8), sVar4 <= sVar15)) &&
         (iVar23 = prev->start, sVar15 <= sVar4)) goto LAB_017a6680;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (sVar15 = WindowCursor::GetCell<short>(pWVar26,0,uVar8 - 1), sVar15 <= sVar4)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_a8,(function<bool_(short,_short)> *)&local_78
              );
    WVar35.pos = iVar23;
    WVar35.coll = pWVar25;
    __last_00.pos = order_end;
    __last_00.coll = pWVar26;
    WVar35 = ::std::
             lower_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::GreaterThan>>
                       (WVar35,__last_00,(short *)&local_58,
                        (OperationCompare<short,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar35.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6680:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case UINT32:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar6 = *(uint *)(pvVar19->data + chunk_idx * 4);
    local_58.months = uVar6;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar17 = WindowCursor::GetCell<unsigned_int>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (uVar6 < uVar17) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar17 = WindowCursor::GetCell<unsigned_int>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (uVar17 < uVar6) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        uVar17 = WindowCursor::GetCell<unsigned_int>(pWVar25,0,uVar8);
        if ((uVar6 <= uVar17) && (iVar23 = prev->start, uVar17 <= uVar6)) goto LAB_017a677f;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (uVar17 = WindowCursor::GetCell<unsigned_int>(pWVar26,0,uVar8 - 1), uVar17 <= uVar6)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_a8,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_78);
    WVar36.pos = iVar23;
    WVar36.coll = pWVar25;
    __last_01.pos = order_end;
    __last_01.coll = pWVar26;
    WVar36 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::GreaterThan>>
                       (WVar36,__last_01,(uint *)&local_58,
                        (OperationCompare<unsigned_int,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar36.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a677f:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case INT32:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    iVar7 = *(int *)(pvVar19->data + chunk_idx * 4);
    local_58.months = iVar7;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar18 = WindowCursor::GetCell<int>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (iVar7 < iVar18) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar18 = WindowCursor::GetCell<int>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (iVar18 < iVar7) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (iVar18 = WindowCursor::GetCell<int>(pWVar25,0,uVar8), iVar7 <= iVar18)) &&
         (iVar23 = prev->start, iVar18 <= iVar7)) goto LAB_017a6da6;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (iVar18 = WindowCursor::GetCell<int>(pWVar26,0,uVar8 - 1), iVar18 <= iVar7)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_a8,(function<bool_(int,_int)> *)&local_78);
    WVar40.pos = iVar23;
    WVar40.coll = pWVar25;
    __last_05.pos = order_end;
    __last_05.coll = pWVar26;
    WVar40 = ::std::
             lower_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::GreaterThan>>
                       (WVar40,__last_05,&local_58.months,
                        (OperationCompare<int,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar40.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6da6:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case UINT64:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar8 = *(ulong *)(pvVar19->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_58._0_8_ = uVar8;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar21 = WindowCursor::GetCell<unsigned_long>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (uVar8 < uVar21) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar21 = WindowCursor::GetCell<unsigned_long>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (uVar21 < uVar8) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar24 = prev->start;
    iVar23 = order_begin;
    if (uVar24 < prev->end) {
      if (uVar24 < order_end && order_begin <= uVar24) {
        uVar21 = WindowCursor::GetCell<unsigned_long>(pWVar25,0,uVar24);
        if ((uVar8 <= uVar21) && (iVar23 = prev->start, uVar21 <= uVar8)) goto LAB_017a657e;
      }
      uVar24 = prev->end;
      if ((uVar24 < order_end && order_begin < uVar24) &&
         (uVar21 = WindowCursor::GetCell<unsigned_long>(pWVar26,0,uVar24 - 1), uVar21 <= uVar8)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_a8,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_78);
    WVar34.pos = iVar23;
    WVar34.coll = pWVar25;
    __last.pos = order_end;
    __last.coll = pWVar26;
    WVar34 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::GreaterThan>>
                       (WVar34,__last,(unsigned_long *)&local_58,
                        (OperationCompare<unsigned_long,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar34.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a657e:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case INT64:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    lVar9 = *(long *)(pvVar19->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_58._0_8_ = lVar9;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar28 = WindowCursor::GetCell<long>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      if (lVar9 < lVar28) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar28 = WindowCursor::GetCell<long>(local_80,0,order_begin);
      pWVar26 = local_88;
      if (lVar28 < lVar9) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar23 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (lVar28 = WindowCursor::GetCell<long>(pWVar25,0,uVar8), lVar9 <= lVar28)) &&
         (iVar23 = prev->start, lVar28 <= lVar9)) goto LAB_017a6ffd;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (lVar28 = WindowCursor::GetCell<long>(pWVar26,0,uVar8 - 1), lVar28 <= lVar9)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_a8,(function<bool_(long,_long)> *)&local_78);
    WVar42.pos = iVar23;
    WVar42.coll = pWVar25;
    __last_07.pos = order_end;
    __last_07.coll = pWVar26;
    WVar42 = ::std::
             lower_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::GreaterThan>>
                       (WVar42,__last_07,(long *)&local_58,
                        (OperationCompare<long,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar42.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6ffd:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_017a5914_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_78._M_unused._M_object = &local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_78);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar11;
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58.months = *(int32_t *)(pvVar19->data + chunk_idx * 4);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      bVar14 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_58);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(local_80,0,order_begin);
      pWVar26 = local_88;
      bVar14 = GreaterThan::Operation<float>((float *)&local_58,(float *)&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar24 = prev->end;
    iVar23 = order_begin;
    if (uVar8 < uVar24) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        fVar31 = WindowCursor::GetCell<float>(pWVar25,0,uVar8);
        local_a8._0_4_ = fVar31;
        bVar14 = GreaterThan::Operation<float>((float *)&local_58,(float *)&local_a8);
        if (!bVar14) {
          bVar14 = GreaterThan::Operation<float>((float *)&local_a8,(float *)&local_58);
          iVar23 = prev->start;
          if (!bVar14) goto LAB_017a7155;
        }
        uVar24 = prev->end;
      }
      if (uVar24 < order_end && order_begin < uVar24) {
        fVar31 = WindowCursor::GetCell<float>(pWVar26,0,uVar24 - 1);
        local_a8._0_4_ = fVar31;
        bVar14 = GreaterThan::Operation<float>((float *)&local_a8,(float *)&local_58);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_a8,(function<bool_(float,_float)> *)&local_78
              );
    WVar43.pos = iVar23;
    WVar43.coll = pWVar25;
    __last_08.pos = order_end;
    __last_08.coll = pWVar26;
    WVar43 = ::std::
             lower_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::GreaterThan>>
                       (WVar43,__last_08,(float *)&local_58,
                        (OperationCompare<float,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar43.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a7155:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case DOUBLE:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      bVar14 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_58);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(local_80,0,order_begin);
      pWVar26 = local_88;
      bVar14 = GreaterThan::Operation<double>((double *)&local_58,(double *)&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar24 = prev->end;
    iVar23 = order_begin;
    if (uVar8 < uVar24) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        local_a8._M_unused._0_8_ = (undefined8)WindowCursor::GetCell<double>(pWVar25,0,uVar8);
        bVar14 = GreaterThan::Operation<double>((double *)&local_58,(double *)&local_a8);
        if (!bVar14) {
          bVar14 = GreaterThan::Operation<double>((double *)&local_a8,(double *)&local_58);
          iVar23 = prev->start;
          if (!bVar14) goto LAB_017a6efe;
        }
        uVar24 = prev->end;
      }
      if (uVar24 < order_end && order_begin < uVar24) {
        dVar10 = WindowCursor::GetCell<double>(pWVar26,0,uVar24 - 1);
        local_a8._M_unused._M_object = (void *)dVar10;
        bVar14 = GreaterThan::Operation<double>((double *)&local_a8,(double *)&local_58);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_a8,
               (function<bool_(double,_double)> *)&local_78);
    WVar41.pos = iVar23;
    WVar41.coll = pWVar25;
    __last_06.pos = order_end;
    __last_06.coll = pWVar26;
    WVar41 = ::std::
             lower_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::GreaterThan>>
                       (WVar41,__last_06,(double *)&local_58,
                        (OperationCompare<double,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar41.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a6efe:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_017a5914_caseD_a;
      pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      pWVar26 = local_80;
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      uVar8 = *(ulong *)(pvVar19->data + chunk_idx * 0x10);
      lVar9 = *(long *)(pvVar19->data + chunk_idx * 0x10 + 8);
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = 0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_58._0_8_ = uVar8;
      local_58.micros = lVar9;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_88,0,order_end - 1);
        if ((lVar9 < hVar32.upper) ||
           (pWVar26 = local_80, uVar8 < hVar32.lower && hVar32.upper == lVar9)) {
          pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a8._M_unused._M_object = &local_98;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
          __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_80,0,order_begin);
        if ((hVar32.upper < lVar9) || (hVar32.lower < uVar8 && lVar9 == hVar32.upper)) {
          pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a8._M_unused._M_object = &local_98;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
          __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar24 = prev->start;
      iVar23 = order_begin;
      if (uVar24 < prev->end) {
        if (uVar24 < order_end && order_begin <= uVar24) {
          hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(pWVar26,0,uVar24);
          lVar28 = hVar32.upper;
          if ((lVar9 <= lVar28) && (uVar8 <= hVar32.lower || lVar9 != lVar28)) {
            iVar23 = prev->start;
            if ((lVar28 <= lVar9) && (hVar32.lower <= uVar8 || lVar9 != lVar28)) goto LAB_017a75d9;
          }
        }
        uVar24 = prev->end;
        if (uVar24 < order_end && order_begin < uVar24) {
          hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_88,0,uVar24 - 1);
          if ((hVar32.upper <= lVar9) && (hVar32.lower <= uVar8 || hVar32.upper != lVar9)) {
            order_end = prev->end + 1;
          }
        }
      }
      pWVar25 = local_88;
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_a8,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_78);
      WVar46.pos = iVar23;
      WVar46.coll = pWVar26;
      __last_11.pos = order_end;
      __last_11.coll = pWVar25;
      WVar46 = ::std::
               lower_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::GreaterThan>>
                         (WVar46,__last_11,(hugeint_t *)&local_58,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::GreaterThan> *)&local_a8);
      iVar23 = WVar46.pos;
      if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
      }
LAB_017a75d9:
      if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
        return iVar23;
      }
      (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
      return iVar23;
    }
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar25 = local_80;
    pWVar26 = local_88;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 0x10);
    local_58.micros = *(int64_t *)(pvVar19->data + chunk_idx * 0x10 + 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(local_88,0,order_end - 1);
      pWVar25 = local_80;
      bVar14 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_58);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(local_80,0,order_begin);
      pWVar26 = local_88;
      bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_58,&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar24 = prev->end;
    iVar23 = order_begin;
    if (uVar8 < uVar24) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        local_a8 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(pWVar25,0,uVar8);
        bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_58,(uhugeint_t *)&local_a8);
        if (!bVar14) {
          bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_a8,(uhugeint_t *)&local_58);
          iVar23 = prev->start;
          if (!bVar14) goto LAB_017a72b6;
        }
        uVar24 = prev->end;
      }
      if (uVar24 < order_end && order_begin < uVar24) {
        local_a8 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(pWVar26,0,uVar24 - 1);
        bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_a8,(uhugeint_t *)&local_58);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_a8,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_78);
    WVar44.pos = iVar23;
    WVar44.coll = pWVar25;
    __last_09.pos = order_end;
    __last_09.coll = pWVar26;
    WVar44 = ::std::
             lower_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::GreaterThan>>
                       (WVar44,__last_09,(uhugeint_t *)&local_58,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::GreaterThan> *)&local_a8);
    iVar23 = WVar44.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017a72b6:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar23;
  }
  pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_58._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 0x10);
  lVar9 = *(long *)(pvVar19->data + chunk_idx * 0x10 + 8);
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_58.micros = lVar9;
  local_48 = local_58._0_8_;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_88,0,order_end - 1);
    lVar28 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
    lVar27 = lVar28 % 0x1e;
    lVar29 = (long)iVar33.months + lVar28 / 0x1e;
    lVar22 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar28 = lVar22 % 0x1e;
    lVar22 = (long)(int)local_48 + lVar22 / 0x1e;
    if ((lVar22 < lVar29) ||
       ((lVar22 <= lVar29 &&
        ((lVar28 < lVar27 ||
         ((lVar28 <= lVar27 && (lVar9 % 86400000000 < iVar33.micros % 86400000000)))))))) {
      pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a8._M_unused._M_object = &local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
      __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_80,0,order_begin);
    lVar28 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar27 = lVar28 % 0x1e;
    lVar29 = (long)(int)local_48 + lVar28 / 0x1e;
    lVar22 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
    lVar28 = lVar22 % 0x1e;
    lVar22 = (long)iVar33.months + lVar22 / 0x1e;
    if ((lVar22 < lVar29) ||
       ((lVar22 <= lVar29 &&
        ((lVar28 < lVar27 ||
         ((lVar28 <= lVar27 && (iVar33.micros % 86400000000 < lVar9 % 86400000000)))))))) {
      pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a8._M_unused._M_object = &local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_a8);
      __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar8 = prev->start;
  if (uVar8 < prev->end) {
    iVar23 = order_begin;
    if (uVar8 < order_end && order_begin <= uVar8) {
      iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_80,0,uVar8);
      lVar28 = (local_48 >> 0x20) + lVar9 / 86400000000;
      lVar27 = lVar28 % 0x1e;
      lVar30 = (long)(int)local_48 + lVar28 / 0x1e;
      lVar22 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
      lVar29 = iVar33.micros % 86400000000;
      lVar28 = lVar22 % 0x1e;
      lVar22 = (long)iVar33.months + lVar22 / 0x1e;
      if (lVar30 <= lVar22) {
        if (lVar22 <= lVar30) {
          if ((lVar28 < lVar27) || ((lVar28 <= lVar27 && (lVar29 < lVar9 % 86400000000))))
          goto LAB_017a73ce;
          if ((lVar28 <= lVar27) && (lVar29 <= lVar9 % 86400000000)) {
            iVar23 = prev->start;
            goto LAB_017a751f;
          }
        }
        iVar23 = prev->start;
      }
    }
LAB_017a73ce:
    uVar8 = prev->end;
    bVar14 = order_begin < uVar8;
    order_begin = iVar23;
    if (uVar8 < order_end && bVar14) {
      iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_88,0,uVar8 - 1);
      lVar28 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
      lVar27 = lVar28 % 0x1e;
      lVar29 = (long)iVar33.months + lVar28 / 0x1e;
      lVar22 = (local_48 >> 0x20) + lVar9 / 86400000000;
      lVar28 = lVar22 % 0x1e;
      lVar22 = (long)(int)local_48 + lVar22 / 0x1e;
      if ((lVar29 <= lVar22) &&
         ((lVar29 < lVar22 ||
          ((lVar27 <= lVar28 &&
           ((lVar27 < lVar28 || (iVar33.micros % 86400000000 <= lVar9 % 86400000000)))))))) {
        order_end = prev->end + 1;
      }
    }
  }
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_a8,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_78);
  WVar45.pos = order_begin;
  WVar45.coll = local_80;
  __last_10.pos = order_end;
  __last_10.coll = local_88;
  WVar45 = ::std::
           lower_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::GreaterThan>>
                     (WVar45,__last_10,&local_58,
                      (OperationCompare<duckdb::interval_t,_duckdb::GreaterThan> *)&local_a8);
  iVar23 = WVar45.pos;
  if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
  }
LAB_017a751f:
  if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
    return iVar23;
  }
  (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
  return iVar23;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}